

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImGuiInputTextState::ClearFreeMemory(ImGuiInputTextState *this)

{
  int *piVar1;
  unsigned_short *puVar2;
  char *pcVar3;
  
  puVar2 = (this->TextW).Data;
  if (puVar2 != (unsigned_short *)0x0) {
    (this->TextW).Size = 0;
    (this->TextW).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(puVar2,GImAllocatorUserData);
    (this->TextW).Data = (unsigned_short *)0x0;
  }
  pcVar3 = (this->TextA).Data;
  if (pcVar3 != (char *)0x0) {
    (this->TextA).Size = 0;
    (this->TextA).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
    (this->TextA).Data = (char *)0x0;
  }
  pcVar3 = (this->InitialTextA).Data;
  if (pcVar3 != (char *)0x0) {
    (this->InitialTextA).Size = 0;
    (this->InitialTextA).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
    (this->InitialTextA).Data = (char *)0x0;
  }
  return;
}

Assistant:

void        ClearFreeMemory()           { TextW.clear(); TextA.clear(); InitialTextA.clear(); }